

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O0

int __thiscall ncnn::LayerNorm::forward_inplace(LayerNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Mat *in_RSI;
  long in_RDI;
  float fVar4;
  double dVar5;
  float fVar6;
  int i_4;
  int i_3;
  float b_1;
  float a_1;
  float var_1;
  int i_2;
  float tmp_1;
  float mean_1;
  int i_1;
  float sqsum_1;
  float sum_1;
  float *ptr_1;
  int q;
  int size;
  int channels;
  int h_1;
  int w_1;
  int j_3;
  int j_2;
  float b;
  float a;
  float var;
  int j_1;
  float tmp;
  float mean;
  int j;
  float sqsum;
  float sum;
  float *ptr;
  int i;
  int h;
  int w;
  int dims;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int local_e4;
  int local_d8;
  float local_d4;
  float local_d0;
  Mat local_c0;
  float *local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  float local_54;
  float local_50;
  float local_4c;
  int local_48;
  float local_44;
  float local_40;
  int local_3c;
  float local_38;
  float local_34;
  float *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  Mat *local_10;
  
  local_1c = in_RSI->dims;
  local_10 = in_RSI;
  if (local_1c == 2) {
    local_20 = in_RSI->w;
    local_24 = in_RSI->h;
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      local_30 = ncnn::Mat::row(local_10,local_28);
      local_34 = 0.0;
      local_38 = 0.0;
      for (local_3c = 0; local_3c < local_20; local_3c = local_3c + 1) {
        local_34 = local_30[local_3c] + local_34;
      }
      local_40 = local_34 / (float)local_20;
      local_44 = 0.0;
      for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
        local_44 = local_30[local_48] - local_40;
        local_38 = local_44 * local_44 + local_38;
      }
      local_4c = local_38 / (float)local_20;
      dVar5 = std::sqrt((double)(ulong)(uint)(local_4c + *(float *)(in_RDI + 0xd4)));
      local_50 = 1.0 / SUB84(dVar5,0);
      local_54 = -local_40 * local_50;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_5c = 0; local_5c < local_20; local_5c = local_5c + 1) {
          local_30[local_5c] = local_30[local_5c] * local_50 + local_54;
        }
      }
      else {
        for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
          fVar4 = local_30[local_58] * local_50 + local_54;
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe0),(long)local_58);
          fVar6 = *pfVar3;
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_58);
          local_30[local_58] = fVar4 * fVar6 + *pfVar3;
        }
      }
    }
  }
  if (local_1c == 3) {
    local_60 = local_10->w;
    local_64 = local_10->h;
    local_68 = local_10->c;
    local_6c = local_60 * local_64;
    for (local_70 = 0; local_70 < local_68; local_70 = local_70 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         (int)((ulong)in_RDI >> 0x20));
      pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_c0);
      ncnn::Mat::~Mat((Mat *)0x90a5f6);
      local_d0 = 0.0;
      local_d4 = 0.0;
      for (local_d8 = 0; local_d8 < local_6c; local_d8 = local_d8 + 1) {
        local_d0 = pfVar3[local_d8] + local_d0;
      }
      fVar6 = (float)local_6c;
      for (local_e4 = 0; local_e4 < local_6c; local_e4 = local_e4 + 1) {
        fVar4 = pfVar3[local_e4] - local_d0 / fVar6;
        local_d4 = fVar4 * fVar4 + local_d4;
      }
      local_78 = pfVar3;
      dVar5 = std::sqrt((double)(ulong)(uint)(local_d4 / (float)local_6c + *(float *)(in_RDI + 0xd4)
                                             ));
      fVar4 = 1.0 / SUB84(dVar5,0);
      fVar6 = -(local_d0 / fVar6) * fVar4;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (in_stack_ffffffffffffff08 = 0; in_stack_ffffffffffffff08 < local_6c;
            in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 + 1) {
          local_78[in_stack_ffffffffffffff08] = local_78[in_stack_ffffffffffffff08] * fVar4 + fVar6;
        }
      }
      else {
        for (in_stack_ffffffffffffff0c = 0; in_stack_ffffffffffffff0c < local_6c;
            in_stack_ffffffffffffff0c = in_stack_ffffffffffffff0c + 1) {
          fVar1 = local_78[in_stack_ffffffffffffff0c];
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe0),(long)in_stack_ffffffffffffff0c);
          fVar2 = *pfVar3;
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x128),(long)in_stack_ffffffffffffff0c);
          local_78[in_stack_ffffffffffffff0c] = (fVar1 * fVar4 + fVar6) * fVar2 + *pfVar3;
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int dims = bottom_top_blob.dims;

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sum += ptr[j];
                //sqsum += ptr[j] * ptr[j];
            }
            float mean = sum / w;
            float tmp = 0.f;
            for (int j = 0; j < w; j++)
            {
                tmp = ptr[j] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / w;
            // the var maybe minus due to accuracy
            //float var = sqsum / w - mean * mean;

            float a = static_cast<float>(1.f / (sqrt(var + eps)));
            float b = -mean * a;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a + b;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;
        // assert affine_size == size

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
                //sqsum += ptr[i] * ptr[i];
            }
            float mean = sum / size;
            float tmp = 0.f;
            for (int i = 0; i < size; i++)
            {
                tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / size;
            // the var maybe minus due to accuracy
            //float var = sqsum / size - mean * mean;

            float a = static_cast<float>(1.f / (sqrt(var + eps)));
            float b = -mean * a;

            if (affine)
            {
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
                }
            }
            else
            {
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    return 0;
}